

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::DescriptorImpl::ToStringHelper
          (DescriptorImpl *this,SigningProvider *arg,string *out,StringType type,
          DescriptorCache *cache)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  size_type sVar4;
  pointer pPVar5;
  undefined4 in_ECX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *pubkey;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *__range2;
  size_t pos;
  const_iterator __end2;
  const_iterator __begin2;
  string subscript;
  string tmp;
  string ret;
  string extra;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  char in_stack_fffffffffffffe37;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  ulong local_170;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = &local_28;
  (**(code **)((in_RDI->_M_dataplus)._M_p + 0x80))();
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffe28);
  std::operator+(in_RDI,(char *)__rhs);
  std::operator+(in_stack_fffffffffffffe40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::__cxx11::string::~string(in_stack_fffffffffffffe28);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::begin((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::end((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  local_170 = (ulong)(sVar4 != 0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                            (__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
    ::operator*((__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                 *)in_stack_fffffffffffffe28);
    if (local_170 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    }
    std::__cxx11::string::string(in_stack_fffffffffffffe40);
    switch(in_ECX) {
    case 0:
      pPVar5 = std::
               unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             *)in_stack_fffffffffffffe28);
      (*pPVar5->_vptr_PubkeyProvider[5])(local_a8,pPVar5,0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
      break;
    case 1:
      pPVar5 = std::
               unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             *)in_stack_fffffffffffffe28);
      uVar3 = (*pPVar5->_vptr_PubkeyProvider[6])(pPVar5,in_RSI,local_88);
      if ((uVar3 & 1) != 0) break;
      local_139 = 0;
      bVar1 = true;
      goto LAB_00e83b86;
    case 2:
      pPVar5 = std::
               unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             *)in_stack_fffffffffffffe28);
      uVar3 = (*pPVar5->_vptr_PubkeyProvider[7])(pPVar5,in_RSI,local_88,in_R8);
      if ((uVar3 & 1) == 0) {
        local_139 = 0;
        bVar1 = true;
        goto LAB_00e83b86;
      }
      break;
    case 3:
      pPVar5 = std::
               unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             *)in_stack_fffffffffffffe28);
      (*pPVar5->_vptr_PubkeyProvider[5])(local_c8,pPVar5,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    bVar1 = false;
LAB_00e83b86:
    std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    if (bVar1) goto LAB_00e83d18;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
    ::operator++((__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                  *)in_stack_fffffffffffffe28);
    local_170 = local_170 + 1;
  }
  this_00 = &local_e8;
  std::__cxx11::string::string(this_00);
  bVar2 = (**(code **)((in_RDI->_M_dataplus)._M_p + 0x90))(in_RDI,in_RSI,this_00,in_ECX,in_R8);
  if ((bVar2 & 1) == 0) {
    local_139 = 0;
  }
  else {
    if ((local_170 != 0) &&
       (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_stack_fffffffffffffe28), sVar4 != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe37);
    }
    std::operator+(in_RDI,__rhs);
    std::operator+(this_00,(char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    local_139 = 1;
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe28);
LAB_00e83d18:
  std::__cxx11::string::~string(in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_139 & 1);
}

Assistant:

virtual bool ToStringHelper(const SigningProvider* arg, std::string& out, const StringType type, const DescriptorCache* cache = nullptr) const
    {
        std::string extra = ToStringExtra();
        size_t pos = extra.size() > 0 ? 1 : 0;
        std::string ret = m_name + "(" + extra;
        for (const auto& pubkey : m_pubkey_args) {
            if (pos++) ret += ",";
            std::string tmp;
            switch (type) {
                case StringType::NORMALIZED:
                    if (!pubkey->ToNormalizedString(*arg, tmp, cache)) return false;
                    break;
                case StringType::PRIVATE:
                    if (!pubkey->ToPrivateString(*arg, tmp)) return false;
                    break;
                case StringType::PUBLIC:
                    tmp = pubkey->ToString();
                    break;
                case StringType::COMPAT:
                    tmp = pubkey->ToString(PubkeyProvider::StringType::COMPAT);
                    break;
            }
            ret += tmp;
        }
        std::string subscript;
        if (!ToStringSubScriptHelper(arg, subscript, type, cache)) return false;
        if (pos && subscript.size()) ret += ',';
        out = std::move(ret) + std::move(subscript) + ")";
        return true;
    }